

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

string * __thiscall
phosg::Subprocess::communicate_abi_cxx11_
          (string *__return_storage_ptr__,Subprocess *this,void *stdin_data,size_t stdin_size,
          uint64_t timeout_usecs)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint64_t uVar3;
  pointer ppVar4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  runtime_error *this_00;
  size_type sVar8;
  reference __str;
  reference __str_00;
  size_t __nbytes;
  int __sig;
  bool bVar9;
  pointer local_1b8;
  string *qi;
  iterator __end3;
  iterator __begin3;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  allocator<char> local_13a;
  bool local_139;
  ssize_t sStack_138;
  bool should_close_stdin;
  ssize_t bytes_written;
  size_t bytes_remaining;
  undefined1 local_108 [8];
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  events;
  uint64_t t;
  undefined1 local_c0 [4];
  int timeout_ms;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stdout_queue;
  size_t stdout_bytes;
  size_t stdin_offset;
  undefined1 local_50 [8];
  Poll p;
  uint64_t deadline_usecs;
  uint64_t timeout_usecs_local;
  size_t stdin_size_local;
  void *stdin_data_local;
  Subprocess *this_local;
  string *ret;
  
  if (timeout_usecs == 0) {
    local_1b8 = (pointer)0x0;
  }
  else {
    uVar3 = now();
    local_1b8 = (pointer)(uVar3 + timeout_usecs);
  }
  p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_1b8;
  Poll::Poll((Poll *)local_50);
  if (stdin_size == 0) {
    close(this->stdin_write_fd);
    this->stdin_write_fd = -1;
  }
  else {
    Poll::add((Poll *)local_50,this->stdin_write_fd,4);
  }
  Poll::add((Poll *)local_50,this->stdout_read_fd,1);
  stdout_bytes = 0;
  stdout_queue.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_c0);
  while( true ) {
    uVar2 = wait(this,(void *)0x1);
    __nbytes = (size_t)uVar2;
    bVar9 = false;
    if ((int)uVar2 < 0) {
      ppVar4 = (pointer)now();
      bVar9 = ppVar4 < p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
    }
    if (!bVar9) goto LAB_0013c8de;
    bVar9 = Poll::empty((Poll *)local_50);
    if (bVar9) break;
    if (p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      t._4_4_ = 0xffffffff;
    }
    else {
      ppVar4 = (pointer)now();
      if (ppVar4 < p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
        __nbytes = 1000;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage - (long)ppVar4;
        t._4_4_ = SUB164(auVar1 / ZEXT816(1000),0);
      }
      else {
        t._4_4_ = 0;
      }
    }
    Poll::poll((Poll *)local_108,(pollfd *)local_50,(ulong)t._4_4_,(int)__nbytes);
    sVar5 = ::std::
            unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
            ::count((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                     *)local_108,&this->stdout_read_fd);
    if (sVar5 != 0) {
      read_abi_cxx11_((phosg *)&bytes_remaining,this->stdout_read_fd,(void *)0x1000,__nbytes);
      ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &bytes_remaining);
      ::std::__cxx11::string::~string((string *)&bytes_remaining);
      pvVar6 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c0);
      bVar9 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar6);
      if (bVar9) {
        Poll::remove((Poll *)local_50,(char *)(ulong)(uint)this->stdout_read_fd);
        this->stdout_read_fd = -1;
      }
      else {
        pvVar6 = std::
                 deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c0);
        sVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar6);
        stdout_queue.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node =
             (_Map_pointer)
             (sVar7 + (long)stdout_queue.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node);
      }
    }
    sVar5 = ::std::
            unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
            ::count((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                     *)local_108,&this->stdin_write_fd);
    if (sVar5 != 0) {
      bytes_written = stdin_size - stdout_bytes;
      sStack_138 = write(this->stdin_write_fd,(void *)((long)stdin_data + stdout_bytes),
                         bytes_written);
      if (sStack_138 < 1) {
        local_139 = true;
      }
      else {
        stdout_bytes = sStack_138 + stdout_bytes;
        local_139 = stdout_bytes == stdin_size;
      }
      if (local_139 != false) {
        Poll::remove((Poll *)local_50,(char *)(ulong)(uint)this->stdin_write_fd);
        this->stdin_write_fd = -1;
      }
    }
    std::
    unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
    ::~unordered_map((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                      *)local_108);
  }
  wait(this,(void *)0x0);
LAB_0013c8de:
  ppVar4 = (pointer)now();
  if (p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage <= ppVar4) {
    kill(this,9,__sig);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Subprocess::communicate timed out");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar9 = ::std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
  if (bVar9) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_13a);
    ::std::allocator<char>::~allocator(&local_13a);
  }
  else {
    sVar8 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0);
    if (sVar8 == 1) {
      __str = ::std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_c0,0);
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
    }
    else {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (size_type)
                 stdout_queue.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((iterator *)&__end3._M_node,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((iterator *)&qi,
            (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0);
      while (bVar9 = ::std::operator==((_Self *)&__end3._M_node,(_Self *)&qi),
            ((bVar9 ^ 0xffU) & 1) != 0) {
        __str_00 = std::
                   _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                   ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                *)&__end3._M_node);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,__str_00);
        ::std::
        _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      *)&__end3._M_node);
      }
    }
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0);
  Poll::~Poll((Poll *)local_50);
  return __return_storage_ptr__;
}

Assistant:

string Subprocess::communicate(
    const void* stdin_data, size_t stdin_size, uint64_t timeout_usecs) {
  uint64_t deadline_usecs = timeout_usecs ? (now() + timeout_usecs) : 0;
  Poll p;
  if (stdin_size == 0) {
    close(this->stdin_write_fd);
    this->stdin_write_fd = -1;
  } else {
    p.add(this->stdin_write_fd, POLLOUT);
  }
  p.add(this->stdout_read_fd, POLLIN);

  size_t stdin_offset = 0;
  size_t stdout_bytes = 0;
  deque<string> stdout_queue;
  while ((this->wait(true) < 0) && (now() < deadline_usecs)) {
    if (p.empty()) {
      this->wait();
      break;
    }

    int timeout_ms;
    if (deadline_usecs) {
      uint64_t t = now();
      if (t < deadline_usecs) {
        timeout_ms = (deadline_usecs - t) / 1000;
      } else {
        timeout_ms = 0;
      }
    } else {
      timeout_ms = -1;
    }
    auto events = p.poll(timeout_ms);

    if (events.count(this->stdout_read_fd)) {
      stdout_queue.emplace_back(read(this->stdout_read_fd, 4096));
      if (stdout_queue.back().empty()) {
        p.remove(this->stdout_read_fd, true);
        this->stdout_read_fd = -1;
      } else {
        stdout_bytes += stdout_queue.back().size();
      }
    }
    if (events.count(this->stdin_write_fd)) {
      size_t bytes_remaining = stdin_size - stdin_offset;
      ssize_t bytes_written = write(
          this->stdin_write_fd,
          reinterpret_cast<const uint8_t*>(stdin_data) + stdin_offset,
          bytes_remaining);

      bool should_close_stdin = false;
      if (bytes_written <= 0) {
        should_close_stdin = true;
      } else {
        stdin_offset += bytes_written;
        should_close_stdin = (stdin_offset == stdin_size);
      }

      if (should_close_stdin) {
        p.remove(this->stdin_write_fd, true);
        this->stdin_write_fd = -1;
      }
    }
  }

  if (now() >= deadline_usecs) {
    // TODO: we should be a bit more polite here - send SIGTERM, wait a few
    // seconds, then send SIGKILL
    this->kill(SIGKILL);
    throw runtime_error("Subprocess::communicate timed out");
  }

  if (stdout_queue.empty()) {
    return "";
  } else if (stdout_queue.size() == 1) {
    return stdout_queue[0];
  } else {
    string ret;
    ret.reserve(stdout_bytes);
    for (const string& qi : stdout_queue) {
      ret += qi;
    }
    return ret;
  }
}